

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  int iVar8;
  undefined4 uVar9;
  ushort uVar10;
  ushort uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  undefined8 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong unaff_R14;
  size_t mask;
  ulong uVar37;
  bool bVar38;
  bool bVar39;
  float fVar40;
  undefined1 auVar45 [16];
  float fVar71;
  float fVar72;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar73;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar87;
  float fVar88;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined4 uVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  RTCFilterFunctionNArguments args;
  PlueckerHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  NodeRef stack [244];
  undefined1 local_ba5;
  uint local_ba4;
  ulong *local_ba0;
  ulong local_b98;
  long local_b90;
  ulong local_b88;
  ulong local_b80;
  ulong local_b78;
  ulong local_b70;
  ulong local_b68;
  size_t local_b60;
  RayK<4> *local_b58;
  undefined1 local_b50 [16];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  ulong local_ac0;
  ulong local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  ulong local_aa0;
  ulong local_a98;
  ulong local_a90;
  ulong local_a88;
  ulong local_a80;
  ulong local_a78;
  long local_a70;
  ulong *local_a68;
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  float local_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [16];
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [16];
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined1 local_970 [16];
  uint local_960;
  uint uStack_95c;
  uint uStack_958;
  uint uStack_954;
  uint uStack_950;
  uint uStack_94c;
  uint uStack_948;
  uint uStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 *local_8e0;
  byte local_8d8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  uint uStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  uint uStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  local_ba0 = local_7f8;
  local_800 = root.ptr;
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar110 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar111 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar112 = ZEXT1664(auVar41);
  fVar82 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar40 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar71 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar82 * 0.99999964)));
  auVar113 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar40 * 0.99999964)));
  auVar114 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar71 * 0.99999964)));
  auVar115 = ZEXT1664(auVar41);
  fVar82 = fVar82 * 1.0000004;
  fVar40 = fVar40 * 1.0000004;
  fVar71 = fVar71 * 1.0000004;
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar34 = uVar26 ^ 0x10;
  uVar37 = uVar31 ^ 0x10;
  uVar35 = uVar33 ^ 0x10;
  iVar8 = (tray->tnear).field_0.i[k];
  local_a50._4_4_ = iVar8;
  local_a50._0_4_ = iVar8;
  local_a50._8_4_ = iVar8;
  local_a50._12_4_ = iVar8;
  auVar108 = ZEXT1664(local_a50);
  iVar8 = (tray->tfar).field_0.i[k];
  local_a60._4_4_ = iVar8;
  local_a60._0_4_ = iVar8;
  local_a60._8_4_ = iVar8;
  local_a60._12_4_ = iVar8;
  auVar109 = ZEXT1664(local_a60);
  local_a88 = uVar26 >> 2;
  local_a90 = uVar34 >> 2;
  local_a98 = uVar31 >> 2;
  local_aa0 = uVar37 >> 2;
  local_aa8 = uVar33 >> 2;
  local_ab0 = uVar35 >> 2;
  local_9e0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fVar72 = fVar82;
  fVar73 = fVar82;
  fVar74 = fVar82;
  fVar75 = fVar40;
  fVar76 = fVar40;
  fVar83 = fVar40;
  fVar84 = fVar71;
  fVar87 = fVar71;
  fVar88 = fVar71;
  local_b80 = uVar34;
  local_b78 = uVar33;
  local_b70 = uVar31;
  local_b68 = uVar26;
  local_b60 = k;
  local_b58 = ray;
  local_a40 = fVar71;
  fStack_a3c = fVar71;
  fStack_a38 = fVar71;
  fStack_a34 = fVar71;
  local_a30 = fVar40;
  fStack_a2c = fVar40;
  fStack_a28 = fVar40;
  fStack_a24 = fVar40;
  local_a20 = fVar82;
  fStack_a1c = fVar82;
  fStack_a18 = fVar82;
  fStack_a14 = fVar82;
  do {
    local_a68 = local_ba0;
    if (local_ba0 == &local_800) break;
    uVar28 = local_ba0[-1];
    local_ba0 = local_ba0 + -1;
    do {
      if ((uVar28 & 8) == 0) {
        auVar41 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar26),auVar110._0_16_);
        auVar41 = vmulps_avx512vl(auVar113._0_16_,auVar41);
        auVar42 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar31),auVar111._0_16_);
        auVar42 = vmulps_avx512vl(auVar114._0_16_,auVar42);
        auVar41 = vmaxps_avx(auVar41,auVar42);
        auVar42 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar33),auVar112._0_16_);
        auVar42 = vmulps_avx512vl(auVar115._0_16_,auVar42);
        auVar43 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar34),auVar110._0_16_);
        auVar44._0_4_ = fVar82 * auVar43._0_4_;
        auVar44._4_4_ = fVar72 * auVar43._4_4_;
        auVar44._8_4_ = fVar73 * auVar43._8_4_;
        auVar44._12_4_ = fVar74 * auVar43._12_4_;
        auVar43 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar37),auVar111._0_16_);
        auVar92._0_4_ = fVar40 * auVar43._0_4_;
        auVar92._4_4_ = fVar75 * auVar43._4_4_;
        auVar92._8_4_ = fVar76 * auVar43._8_4_;
        auVar92._12_4_ = fVar83 * auVar43._12_4_;
        auVar43 = vminps_avx(auVar44,auVar92);
        auVar44 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar35),auVar112._0_16_);
        auVar93._0_4_ = fVar71 * auVar44._0_4_;
        auVar93._4_4_ = fVar84 * auVar44._4_4_;
        auVar93._8_4_ = fVar87 * auVar44._8_4_;
        auVar93._12_4_ = fVar88 * auVar44._12_4_;
        auVar42 = vmaxps_avx(auVar42,auVar108._0_16_);
        auVar41 = vmaxps_avx(auVar41,auVar42);
        auVar42 = vminps_avx(auVar93,auVar109._0_16_);
        auVar42 = vminps_avx(auVar43,auVar42);
        uVar14 = vcmpps_avx512vl(auVar41,auVar42,2);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),(uint)(byte)uVar14);
      }
      if ((uVar28 & 8) == 0) {
        if (unaff_R14 == 0) {
          uVar24 = 4;
        }
        else {
          uVar27 = uVar28 & 0xfffffffffffffff0;
          lVar25 = 0;
          for (uVar28 = unaff_R14; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          uVar24 = 0;
          for (uVar29 = unaff_R14 - 1 & unaff_R14; uVar28 = *(ulong *)(uVar27 + lVar25 * 8),
              uVar29 != 0; uVar29 = uVar29 - 1 & uVar29) {
            *local_ba0 = uVar28;
            local_ba0 = local_ba0 + 1;
            lVar25 = 0;
            for (uVar28 = uVar29; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              lVar25 = lVar25 + 1;
            }
          }
        }
      }
      else {
        uVar24 = 6;
      }
    } while (uVar24 == 0);
    if (uVar24 == 6) {
      local_ab8 = (ulong)((uint)uVar28 & 0xf) - 8;
      bVar38 = local_ab8 != 0;
      if (bVar38) {
        uVar28 = uVar28 & 0xfffffffffffffff0;
        local_a78 = 0;
        do {
          lVar25 = local_a78 * 0x58;
          local_a70 = uVar28 + lVar25;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = *(ulong *)(uVar28 + 0x20 + lVar25);
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)(uVar28 + 0x24 + lVar25);
          uVar27 = vpcmpub_avx512vl(auVar41,auVar42,2);
          uVar9 = *(undefined4 *)(uVar28 + 0x38 + lVar25);
          auVar43._4_4_ = uVar9;
          auVar43._0_4_ = uVar9;
          auVar43._8_4_ = uVar9;
          auVar43._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(uVar28 + 0x44 + lVar25);
          auVar79._4_4_ = uVar9;
          auVar79._0_4_ = uVar9;
          auVar79._8_4_ = uVar9;
          auVar79._12_4_ = uVar9;
          auVar85._8_8_ = 0;
          auVar85._0_8_ = *(ulong *)(local_a88 + 0x20 + local_a70);
          auVar41 = vpmovzxbd_avx(auVar85);
          auVar41 = vcvtdq2ps_avx(auVar41);
          auVar42 = vfmadd213ps_fma(auVar41,auVar79,auVar43);
          auVar94._8_8_ = 0;
          auVar94._0_8_ = *(ulong *)(local_a90 + 0x20 + local_a70);
          auVar41 = vpmovzxbd_avx(auVar94);
          auVar41 = vcvtdq2ps_avx(auVar41);
          auVar43 = vfmadd213ps_fma(auVar41,auVar79,auVar43);
          uVar9 = *(undefined4 *)(uVar28 + 0x3c + lVar25);
          auVar77._4_4_ = uVar9;
          auVar77._0_4_ = uVar9;
          auVar77._8_4_ = uVar9;
          auVar77._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(uVar28 + 0x48 + lVar25);
          auVar80._4_4_ = uVar9;
          auVar80._0_4_ = uVar9;
          auVar80._8_4_ = uVar9;
          auVar80._12_4_ = uVar9;
          auVar97._8_8_ = 0;
          auVar97._0_8_ = *(ulong *)(local_a98 + 0x20 + local_a70);
          auVar41 = vpmovzxbd_avx(auVar97);
          auVar41 = vcvtdq2ps_avx(auVar41);
          auVar44 = vfmadd213ps_fma(auVar41,auVar80,auVar77);
          auVar101._8_8_ = 0;
          auVar101._0_8_ = *(ulong *)(local_aa0 + 0x20 + local_a70);
          auVar41 = vpmovzxbd_avx(auVar101);
          auVar41 = vcvtdq2ps_avx(auVar41);
          auVar92 = vfmadd213ps_fma(auVar41,auVar80,auVar77);
          uVar9 = *(undefined4 *)(uVar28 + 0x40 + lVar25);
          auVar78._4_4_ = uVar9;
          auVar78._0_4_ = uVar9;
          auVar78._8_4_ = uVar9;
          auVar78._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(uVar28 + 0x4c + lVar25);
          auVar81._4_4_ = uVar9;
          auVar81._0_4_ = uVar9;
          auVar81._8_4_ = uVar9;
          auVar81._12_4_ = uVar9;
          auVar102._8_8_ = 0;
          auVar102._0_8_ = *(ulong *)(local_aa8 + 0x20 + local_a70);
          auVar41 = vpmovzxbd_avx(auVar102);
          auVar41 = vcvtdq2ps_avx(auVar41);
          auVar93 = vfmadd213ps_fma(auVar41,auVar81,auVar78);
          auVar104._8_8_ = 0;
          auVar104._0_8_ = *(ulong *)(local_ab0 + 0x20 + local_a70);
          auVar41 = vpmovzxbd_avx(auVar104);
          auVar41 = vcvtdq2ps_avx(auVar41);
          auVar77 = vfmadd213ps_fma(auVar41,auVar81,auVar78);
          auVar41 = vsubps_avx512vl(auVar42,auVar110._0_16_);
          auVar41 = vmulps_avx512vl(auVar113._0_16_,auVar41);
          auVar42 = vsubps_avx512vl(auVar44,auVar111._0_16_);
          auVar42 = vmulps_avx512vl(auVar114._0_16_,auVar42);
          auVar41 = vmaxps_avx(auVar41,auVar42);
          auVar42 = vsubps_avx512vl(auVar93,auVar112._0_16_);
          auVar42 = vmulps_avx512vl(auVar115._0_16_,auVar42);
          auVar43 = vsubps_avx512vl(auVar43,auVar110._0_16_);
          auVar86._0_4_ = fVar82 * auVar43._0_4_;
          auVar86._4_4_ = fVar72 * auVar43._4_4_;
          auVar86._8_4_ = fVar73 * auVar43._8_4_;
          auVar86._12_4_ = fVar74 * auVar43._12_4_;
          auVar43 = vsubps_avx512vl(auVar92,auVar111._0_16_);
          auVar95._0_4_ = fVar40 * auVar43._0_4_;
          auVar95._4_4_ = fVar75 * auVar43._4_4_;
          auVar95._8_4_ = fVar76 * auVar43._8_4_;
          auVar95._12_4_ = fVar83 * auVar43._12_4_;
          auVar43 = vminps_avx(auVar86,auVar95);
          auVar44 = vsubps_avx512vl(auVar77,auVar112._0_16_);
          auVar96._0_4_ = fVar71 * auVar44._0_4_;
          auVar96._4_4_ = fVar84 * auVar44._4_4_;
          auVar96._8_4_ = fVar87 * auVar44._8_4_;
          auVar96._12_4_ = fVar88 * auVar44._12_4_;
          auVar42 = vmaxps_avx(auVar42,auVar108._0_16_);
          auVar41 = vmaxps_avx(auVar41,auVar42);
          auVar42 = vminps_avx(auVar96,auVar109._0_16_);
          auVar42 = vminps_avx(auVar43,auVar42);
          local_a80 = vcmpps_avx512vl(auVar41,auVar42,2);
          local_a80 = uVar27 & 0xff & local_a80;
          if ((char)local_a80 != '\0') {
            do {
              lVar25 = 0;
              for (uVar26 = local_a80; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000)
              {
                lVar25 = lVar25 + 1;
              }
              uVar10 = *(ushort *)(local_a70 + lVar25 * 8);
              uVar11 = *(ushort *)(local_a70 + 2 + lVar25 * 8);
              local_ac0 = (ulong)*(uint *)(local_a70 + 4 + lVar25 * 8);
              pGVar12 = (context->scene->geometries).items[*(uint *)(local_a70 + 0x50)].ptr;
              local_b90 = *(long *)&pGVar12->field_0x58;
              lVar30 = pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                       * local_ac0;
              local_ba4 = uVar11 & 0x7fff;
              uVar24 = *(uint *)(local_b90 + 4 + lVar30);
              uVar33 = (ulong)uVar24;
              uVar31 = (ulong)(uVar24 * local_ba4 + *(int *)(local_b90 + lVar30) + (uVar10 & 0x7fff)
                              );
              lVar25 = *(long *)&pGVar12[1].time_range.upper;
              p_Var13 = pGVar12[1].intersectionFilterN;
              auVar41 = *(undefined1 (*) [16])(lVar25 + (uVar31 + 1) * (long)p_Var13);
              auVar42 = *(undefined1 (*) [16])(lVar25 + (uVar31 + uVar33) * (long)p_Var13);
              lVar36 = uVar31 + uVar33 + 1;
              auVar43 = *(undefined1 (*) [16])(lVar25 + lVar36 * (long)p_Var13);
              uVar26 = (ulong)(-1 < (short)uVar10);
              auVar44 = *(undefined1 (*) [16])(lVar25 + (uVar31 + uVar26 + 1) * (long)p_Var13);
              lVar32 = uVar26 + lVar36;
              auVar92 = *(undefined1 (*) [16])(lVar25 + lVar32 * (long)p_Var13);
              uVar26 = 0;
              if (-1 < (short)uVar11) {
                uVar26 = uVar33;
              }
              auVar93 = *(undefined1 (*) [16])(lVar25 + (uVar31 + uVar33 + uVar26) * (long)p_Var13);
              auVar77 = *(undefined1 (*) [16])(lVar25 + (lVar36 + uVar26) * (long)p_Var13);
              auVar55._16_16_ = *(undefined1 (*) [16])(lVar25 + (uVar26 + lVar32) * (long)p_Var13);
              auVar55._0_16_ = auVar43;
              auVar79 = vunpcklps_avx(auVar41,auVar92);
              auVar78 = vunpckhps_avx(auVar41,auVar92);
              auVar80 = vunpcklps_avx(auVar44,auVar43);
              auVar44 = vunpckhps_avx(auVar44,auVar43);
              auVar81 = vunpcklps_avx(auVar78,auVar44);
              auVar85 = vunpcklps_avx(auVar79,auVar80);
              auVar44 = vunpckhps_avx(auVar79,auVar80);
              auVar79 = vunpcklps_avx(auVar42,auVar77);
              auVar78 = vunpckhps_avx(auVar42,auVar77);
              auVar80 = vunpcklps_avx(auVar43,auVar93);
              auVar93 = vunpckhps_avx(auVar43,auVar93);
              auVar78 = vunpcklps_avx(auVar78,auVar93);
              auVar86 = vunpcklps_avx(auVar79,auVar80);
              auVar93 = vunpckhps_avx(auVar79,auVar80);
              auVar52._16_16_ = auVar77;
              auVar52._0_16_ = auVar42;
              auVar50._16_16_ = auVar92;
              auVar50._0_16_ = auVar41;
              auVar70 = vunpcklps_avx(auVar50,auVar52);
              auVar47._16_16_ = auVar43;
              auVar47._0_16_ = *(undefined1 (*) [16])(lVar25 + (long)p_Var13 * uVar31);
              auVar69 = vunpcklps_avx(auVar47,auVar55);
              auVar66 = vunpcklps_avx(auVar69,auVar70);
              auVar69 = vunpckhps_avx(auVar69,auVar70);
              auVar70 = vunpckhps_avx(auVar50,auVar52);
              auVar65 = vunpckhps_avx(auVar47,auVar55);
              auVar65 = vunpcklps_avx(auVar65,auVar70);
              auVar51._16_16_ = auVar85;
              auVar51._0_16_ = auVar85;
              auVar53._16_16_ = auVar44;
              auVar53._0_16_ = auVar44;
              auVar54._16_16_ = auVar81;
              auVar54._0_16_ = auVar81;
              auVar56._16_16_ = auVar86;
              auVar56._0_16_ = auVar86;
              auVar58._16_16_ = auVar93;
              auVar58._0_16_ = auVar93;
              uVar9 = *(undefined4 *)(local_b58 + local_b60 * 4);
              auVar59._4_4_ = uVar9;
              auVar59._0_4_ = uVar9;
              auVar59._8_4_ = uVar9;
              auVar59._12_4_ = uVar9;
              auVar59._16_4_ = uVar9;
              auVar59._20_4_ = uVar9;
              auVar59._24_4_ = uVar9;
              auVar59._28_4_ = uVar9;
              uVar9 = *(undefined4 *)(local_b58 + local_b60 * 4 + 0x10);
              auVar60._4_4_ = uVar9;
              auVar60._0_4_ = uVar9;
              auVar60._8_4_ = uVar9;
              auVar60._12_4_ = uVar9;
              auVar60._16_4_ = uVar9;
              auVar60._20_4_ = uVar9;
              auVar60._24_4_ = uVar9;
              auVar60._28_4_ = uVar9;
              auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_b58 + local_b60 * 4 + 0x20)));
              uVar9 = *(undefined4 *)(local_b58 + local_b60 * 4 + 0x40);
              auVar103._4_4_ = uVar9;
              auVar103._0_4_ = uVar9;
              auVar103._8_4_ = uVar9;
              auVar103._12_4_ = uVar9;
              auVar103._16_4_ = uVar9;
              auVar103._20_4_ = uVar9;
              auVar103._24_4_ = uVar9;
              auVar103._28_4_ = uVar9;
              auVar57._16_16_ = auVar78;
              auVar57._0_16_ = auVar78;
              uVar9 = *(undefined4 *)(local_b58 + local_b60 * 4 + 0x50);
              auVar105._4_4_ = uVar9;
              auVar105._0_4_ = uVar9;
              auVar105._8_4_ = uVar9;
              auVar105._12_4_ = uVar9;
              auVar105._16_4_ = uVar9;
              auVar105._20_4_ = uVar9;
              auVar105._24_4_ = uVar9;
              auVar105._28_4_ = uVar9;
              fVar82 = *(float *)(local_b58 + local_b60 * 4 + 0x60);
              auVar107._4_4_ = fVar82;
              auVar107._0_4_ = fVar82;
              auVar107._8_4_ = fVar82;
              auVar107._12_4_ = fVar82;
              auVar107._16_4_ = fVar82;
              auVar107._20_4_ = fVar82;
              auVar107._24_4_ = fVar82;
              auVar107._28_4_ = fVar82;
              auVar70 = vsubps_avx(auVar66,auVar59);
              auVar69 = vsubps_avx(auVar69,auVar60);
              auVar47 = vsubps_avx512vl(auVar65,auVar46);
              auVar65 = vsubps_avx(auVar51,auVar59);
              auVar66 = vsubps_avx(auVar53,auVar60);
              auVar48 = vsubps_avx512vl(auVar54,auVar46);
              auVar49 = vsubps_avx512vl(auVar56,auVar59);
              auVar50 = vsubps_avx512vl(auVar58,auVar60);
              auVar51 = vsubps_avx512vl(auVar57,auVar46);
              auVar52 = vsubps_avx512vl(auVar49,auVar70);
              auVar53 = vsubps_avx512vl(auVar50,auVar69);
              auVar54 = vsubps_avx512vl(auVar51,auVar47);
              auVar55 = vsubps_avx512vl(auVar70,auVar65);
              auVar56 = vsubps_avx512vl(auVar69,auVar66);
              auVar57 = vsubps_avx512vl(auVar47,auVar48);
              auVar58 = vsubps_avx512vl(auVar65,auVar49);
              auVar59 = vsubps_avx512vl(auVar66,auVar50);
              auVar60 = vsubps_avx512vl(auVar48,auVar51);
              auVar61 = vaddps_avx512vl(auVar49,auVar70);
              auVar62 = vaddps_avx512vl(auVar50,auVar69);
              auVar46 = vaddps_avx512vl(auVar51,auVar47);
              auVar63 = vmulps_avx512vl(auVar62,auVar54);
              auVar63 = vfmsub231ps_avx512vl(auVar63,auVar53,auVar46);
              auVar46 = vmulps_avx512vl(auVar46,auVar52);
              auVar64 = vfmsub231ps_avx512vl(auVar46,auVar54,auVar61);
              auVar46._4_4_ = auVar61._4_4_ * auVar53._4_4_;
              auVar46._0_4_ = auVar61._0_4_ * auVar53._0_4_;
              auVar46._8_4_ = auVar61._8_4_ * auVar53._8_4_;
              auVar46._12_4_ = auVar61._12_4_ * auVar53._12_4_;
              auVar46._16_4_ = auVar61._16_4_ * auVar53._16_4_;
              auVar46._20_4_ = auVar61._20_4_ * auVar53._20_4_;
              auVar46._24_4_ = auVar61._24_4_ * auVar53._24_4_;
              auVar46._28_4_ = auVar61._28_4_;
              auVar41 = vfmsub231ps_fma(auVar46,auVar52,auVar62);
              auVar62._0_4_ = auVar41._0_4_ * fVar82;
              auVar62._4_4_ = auVar41._4_4_ * fVar82;
              auVar62._8_4_ = auVar41._8_4_ * fVar82;
              auVar62._12_4_ = auVar41._12_4_ * fVar82;
              auVar62._16_4_ = fVar82 * 0.0;
              auVar62._20_4_ = fVar82 * 0.0;
              auVar62._24_4_ = fVar82 * 0.0;
              auVar62._28_4_ = 0;
              auVar46 = vfmadd231ps_avx512vl(auVar62,auVar105,auVar64);
              auVar46 = vfmadd231ps_avx512vl(auVar46,auVar103,auVar63);
              auVar64._0_4_ = auVar70._0_4_ + auVar65._0_4_;
              auVar64._4_4_ = auVar70._4_4_ + auVar65._4_4_;
              auVar64._8_4_ = auVar70._8_4_ + auVar65._8_4_;
              auVar64._12_4_ = auVar70._12_4_ + auVar65._12_4_;
              auVar64._16_4_ = auVar70._16_4_ + auVar65._16_4_;
              auVar64._20_4_ = auVar70._20_4_ + auVar65._20_4_;
              auVar64._24_4_ = auVar70._24_4_ + auVar65._24_4_;
              auVar64._28_4_ = auVar70._28_4_ + auVar65._28_4_;
              auVar61 = vaddps_avx512vl(auVar69,auVar66);
              auVar62 = vaddps_avx512vl(auVar47,auVar48);
              auVar63 = vmulps_avx512vl(auVar61,auVar57);
              auVar63 = vfmsub231ps_avx512vl(auVar63,auVar56,auVar62);
              auVar62 = vmulps_avx512vl(auVar62,auVar55);
              auVar62 = vfmsub231ps_avx512vl(auVar62,auVar57,auVar64);
              auVar64 = vmulps_avx512vl(auVar64,auVar56);
              auVar64 = vfmsub231ps_avx512vl(auVar64,auVar55,auVar61);
              auVar61._4_4_ = auVar64._4_4_ * fVar82;
              auVar61._0_4_ = auVar64._0_4_ * fVar82;
              auVar61._8_4_ = auVar64._8_4_ * fVar82;
              auVar61._12_4_ = auVar64._12_4_ * fVar82;
              auVar61._16_4_ = auVar64._16_4_ * fVar82;
              auVar61._20_4_ = auVar64._20_4_ * fVar82;
              auVar61._24_4_ = auVar64._24_4_ * fVar82;
              auVar61._28_4_ = auVar64._28_4_;
              auVar61 = vfmadd231ps_avx512vl(auVar61,auVar105,auVar62);
              auVar61 = vfmadd231ps_avx512vl(auVar61,auVar103,auVar63);
              auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar65 = vaddps_avx512vl(auVar65,auVar49);
              auVar66 = vaddps_avx512vl(auVar66,auVar50);
              auVar48 = vaddps_avx512vl(auVar48,auVar51);
              auVar49 = vmulps_avx512vl(auVar66,auVar60);
              auVar49 = vfmsub231ps_avx512vl(auVar49,auVar59,auVar48);
              auVar48 = vmulps_avx512vl(auVar48,auVar58);
              auVar50 = vfmsub231ps_avx512vl(auVar48,auVar60,auVar65);
              auVar48._4_4_ = auVar65._4_4_ * auVar59._4_4_;
              auVar48._0_4_ = auVar65._0_4_ * auVar59._0_4_;
              auVar48._8_4_ = auVar65._8_4_ * auVar59._8_4_;
              auVar48._12_4_ = auVar65._12_4_ * auVar59._12_4_;
              auVar48._16_4_ = auVar65._16_4_ * auVar59._16_4_;
              auVar48._20_4_ = auVar65._20_4_ * auVar59._20_4_;
              auVar48._24_4_ = auVar65._24_4_ * auVar59._24_4_;
              auVar48._28_4_ = auVar65._28_4_;
              auVar41 = vfmsub231ps_fma(auVar48,auVar58,auVar66);
              auVar65 = vmulps_avx512vl(ZEXT1632(auVar41),auVar107);
              auVar65 = vfmadd231ps_avx512vl(auVar65,auVar105,auVar50);
              auVar48 = vfmadd231ps_avx512vl(auVar65,auVar103,auVar49);
              auVar49._0_4_ = auVar46._0_4_ + auVar61._0_4_;
              auVar49._4_4_ = auVar46._4_4_ + auVar61._4_4_;
              auVar49._8_4_ = auVar46._8_4_ + auVar61._8_4_;
              auVar49._12_4_ = auVar46._12_4_ + auVar61._12_4_;
              auVar49._16_4_ = auVar46._16_4_ + auVar61._16_4_;
              auVar49._20_4_ = auVar46._20_4_ + auVar61._20_4_;
              auVar49._24_4_ = auVar46._24_4_ + auVar61._24_4_;
              auVar49._28_4_ = auVar46._28_4_ + auVar61._28_4_;
              local_900 = vaddps_avx512vl(auVar48,auVar49);
              vandps_avx512vl(local_900,auVar62);
              auVar65._8_4_ = 0x34000000;
              auVar65._0_8_ = 0x3400000034000000;
              auVar65._12_4_ = 0x34000000;
              auVar65._16_4_ = 0x34000000;
              auVar65._20_4_ = 0x34000000;
              auVar65._24_4_ = 0x34000000;
              auVar65._28_4_ = 0x34000000;
              auVar65 = vmulps_avx512vl(local_900,auVar65);
              auVar66 = vminps_avx512vl(auVar46,auVar61);
              auVar49 = vminps_avx512vl(auVar66,auVar48);
              auVar66._8_4_ = 0x80000000;
              auVar66._0_8_ = 0x8000000080000000;
              auVar66._12_4_ = 0x80000000;
              auVar66._16_4_ = 0x80000000;
              auVar66._20_4_ = 0x80000000;
              auVar66._24_4_ = 0x80000000;
              auVar66._28_4_ = 0x80000000;
              auVar66 = vxorps_avx512vl(auVar65,auVar66);
              uVar14 = vcmpps_avx512vl(auVar49,auVar66,5);
              auVar66 = vmaxps_avx512vl(auVar46,auVar61);
              auVar66 = vmaxps_avx512vl(auVar66,auVar48);
              uVar15 = vcmpps_avx512vl(auVar66,auVar65,2);
              local_8d8 = (byte)uVar14 | (byte)uVar15;
              uVar26 = local_b68;
              k = local_b60;
              uVar31 = local_b70;
              ray = local_b58;
              uVar33 = local_b78;
              uVar34 = local_b80;
              if (local_8d8 != 0) {
                auVar65 = vmulps_avx512vl(auVar56,auVar54);
                auVar66 = vmulps_avx512vl(auVar52,auVar57);
                auVar48 = vmulps_avx512vl(auVar55,auVar53);
                auVar49 = vmulps_avx512vl(auVar59,auVar57);
                auVar50 = vmulps_avx512vl(auVar55,auVar60);
                auVar51 = vmulps_avx512vl(auVar58,auVar56);
                auVar53 = vfmsub213ps_avx512vl(auVar53,auVar57,auVar65);
                auVar54 = vfmsub213ps_avx512vl(auVar54,auVar55,auVar66);
                auVar52 = vfmsub213ps_avx512vl(auVar52,auVar56,auVar48);
                auVar60 = vfmsub213ps_avx512vl(auVar60,auVar56,auVar49);
                auVar57 = vfmsub213ps_avx512vl(auVar58,auVar57,auVar50);
                auVar55 = vfmsub213ps_avx512vl(auVar59,auVar55,auVar51);
                vandps_avx512vl(auVar65,auVar62);
                vandps_avx512vl(auVar49,auVar62);
                uVar27 = vcmpps_avx512vl(auVar55,auVar55,1);
                vandps_avx512vl(auVar66,auVar62);
                vandps_avx512vl(auVar50,auVar62);
                uVar29 = vcmpps_avx512vl(auVar55,auVar55,1);
                vandps_avx512vl(auVar48,auVar62);
                vandps_avx512vl(auVar51,auVar62);
                uVar16 = vcmpps_avx512vl(auVar55,auVar55,1);
                bVar39 = (bool)((byte)uVar27 & 1);
                auVar67._0_4_ =
                     (float)((uint)bVar39 * auVar53._0_4_ | (uint)!bVar39 * auVar60._0_4_);
                bVar39 = (bool)((byte)(uVar27 >> 1) & 1);
                auVar67._4_4_ =
                     (float)((uint)bVar39 * auVar53._4_4_ | (uint)!bVar39 * auVar60._4_4_);
                bVar39 = (bool)((byte)(uVar27 >> 2) & 1);
                auVar67._8_4_ =
                     (float)((uint)bVar39 * auVar53._8_4_ | (uint)!bVar39 * auVar60._8_4_);
                bVar39 = (bool)((byte)(uVar27 >> 3) & 1);
                auVar67._12_4_ =
                     (float)((uint)bVar39 * auVar53._12_4_ | (uint)!bVar39 * auVar60._12_4_);
                bVar39 = (bool)((byte)(uVar27 >> 4) & 1);
                auVar67._16_4_ =
                     (float)((uint)bVar39 * auVar53._16_4_ | (uint)!bVar39 * auVar60._16_4_);
                bVar39 = (bool)((byte)(uVar27 >> 5) & 1);
                auVar67._20_4_ =
                     (float)((uint)bVar39 * auVar53._20_4_ | (uint)!bVar39 * auVar60._20_4_);
                bVar39 = (bool)((byte)(uVar27 >> 6) & 1);
                auVar67._24_4_ =
                     (float)((uint)bVar39 * auVar53._24_4_ | (uint)!bVar39 * auVar60._24_4_);
                bVar39 = SUB81(uVar27 >> 7,0);
                auVar67._28_4_ = (uint)bVar39 * auVar53._28_4_ | (uint)!bVar39 * auVar60._28_4_;
                bVar39 = (bool)((byte)uVar29 & 1);
                auVar68._0_4_ =
                     (float)((uint)bVar39 * auVar54._0_4_ | (uint)!bVar39 * auVar57._0_4_);
                bVar39 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar68._4_4_ =
                     (float)((uint)bVar39 * auVar54._4_4_ | (uint)!bVar39 * auVar57._4_4_);
                bVar39 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar68._8_4_ =
                     (float)((uint)bVar39 * auVar54._8_4_ | (uint)!bVar39 * auVar57._8_4_);
                bVar39 = (bool)((byte)(uVar29 >> 3) & 1);
                auVar68._12_4_ =
                     (float)((uint)bVar39 * auVar54._12_4_ | (uint)!bVar39 * auVar57._12_4_);
                bVar39 = (bool)((byte)(uVar29 >> 4) & 1);
                auVar68._16_4_ =
                     (float)((uint)bVar39 * auVar54._16_4_ | (uint)!bVar39 * auVar57._16_4_);
                bVar39 = (bool)((byte)(uVar29 >> 5) & 1);
                auVar68._20_4_ =
                     (float)((uint)bVar39 * auVar54._20_4_ | (uint)!bVar39 * auVar57._20_4_);
                bVar39 = (bool)((byte)(uVar29 >> 6) & 1);
                auVar68._24_4_ =
                     (float)((uint)bVar39 * auVar54._24_4_ | (uint)!bVar39 * auVar57._24_4_);
                bVar39 = SUB81(uVar29 >> 7,0);
                auVar68._28_4_ = (uint)bVar39 * auVar54._28_4_ | (uint)!bVar39 * auVar57._28_4_;
                bVar39 = (bool)((byte)uVar16 & 1);
                fVar40 = (float)((uint)bVar39 * auVar52._0_4_ | (uint)!bVar39 * auVar55._0_4_);
                bVar39 = (bool)((byte)(uVar16 >> 1) & 1);
                fVar71 = (float)((uint)bVar39 * auVar52._4_4_ | (uint)!bVar39 * auVar55._4_4_);
                bVar39 = (bool)((byte)(uVar16 >> 2) & 1);
                fVar72 = (float)((uint)bVar39 * auVar52._8_4_ | (uint)!bVar39 * auVar55._8_4_);
                bVar39 = (bool)((byte)(uVar16 >> 3) & 1);
                fVar73 = (float)((uint)bVar39 * auVar52._12_4_ | (uint)!bVar39 * auVar55._12_4_);
                bVar39 = (bool)((byte)(uVar16 >> 4) & 1);
                fVar74 = (float)((uint)bVar39 * auVar52._16_4_ | (uint)!bVar39 * auVar55._16_4_);
                bVar39 = (bool)((byte)(uVar16 >> 5) & 1);
                fVar75 = (float)((uint)bVar39 * auVar52._20_4_ | (uint)!bVar39 * auVar55._20_4_);
                bVar39 = (bool)((byte)(uVar16 >> 6) & 1);
                fVar76 = (float)((uint)bVar39 * auVar52._24_4_ | (uint)!bVar39 * auVar55._24_4_);
                bVar39 = SUB81(uVar16 >> 7,0);
                auVar18._4_4_ = fVar82 * fVar71;
                auVar18._0_4_ = fVar82 * fVar40;
                auVar18._8_4_ = fVar82 * fVar72;
                auVar18._12_4_ = fVar82 * fVar73;
                auVar18._16_4_ = fVar82 * fVar74;
                auVar18._20_4_ = fVar82 * fVar75;
                auVar18._24_4_ = fVar82 * fVar76;
                auVar18._28_4_ = fVar82;
                auVar41 = vfmadd213ps_fma(auVar105,auVar68,auVar18);
                auVar41 = vfmadd213ps_fma(auVar103,auVar67,ZEXT1632(auVar41));
                auVar65 = ZEXT1632(CONCAT412(auVar41._12_4_ + auVar41._12_4_,
                                             CONCAT48(auVar41._8_4_ + auVar41._8_4_,
                                                      CONCAT44(auVar41._4_4_ + auVar41._4_4_,
                                                               auVar41._0_4_ + auVar41._0_4_))));
                auVar106._0_4_ = auVar47._0_4_ * fVar40;
                auVar106._4_4_ = auVar47._4_4_ * fVar71;
                auVar106._8_4_ = auVar47._8_4_ * fVar72;
                auVar106._12_4_ = auVar47._12_4_ * fVar73;
                auVar106._16_4_ = auVar47._16_4_ * fVar74;
                auVar106._20_4_ = auVar47._20_4_ * fVar75;
                auVar106._24_4_ = auVar47._24_4_ * fVar76;
                auVar106._28_4_ = 0;
                auVar41 = vfmadd213ps_fma(auVar69,auVar68,auVar106);
                auVar42 = vfmadd213ps_fma(auVar70,auVar67,ZEXT1632(auVar41));
                auVar69 = vrcp14ps_avx512vl(auVar65);
                auVar70._8_4_ = 0x3f800000;
                auVar70._0_8_ = &DAT_3f8000003f800000;
                auVar70._12_4_ = 0x3f800000;
                auVar70._16_4_ = 0x3f800000;
                auVar70._20_4_ = 0x3f800000;
                auVar70._24_4_ = 0x3f800000;
                auVar70._28_4_ = 0x3f800000;
                auVar70 = vfnmadd213ps_avx512vl(auVar69,auVar65,auVar70);
                auVar41 = vfmadd132ps_fma(auVar70,auVar69,auVar69);
                local_880 = ZEXT1632(CONCAT412(auVar41._12_4_ * (auVar42._12_4_ + auVar42._12_4_),
                                               CONCAT48(auVar41._8_4_ *
                                                        (auVar42._8_4_ + auVar42._8_4_),
                                                        CONCAT44(auVar41._4_4_ *
                                                                 (auVar42._4_4_ + auVar42._4_4_),
                                                                 auVar41._0_4_ *
                                                                 (auVar42._0_4_ + auVar42._0_4_)))))
                ;
                uVar9 = *(undefined4 *)(local_b58 + local_b60 * 4 + 0x30);
                auVar69._4_4_ = uVar9;
                auVar69._0_4_ = uVar9;
                auVar69._8_4_ = uVar9;
                auVar69._12_4_ = uVar9;
                auVar69._16_4_ = uVar9;
                auVar69._20_4_ = uVar9;
                auVar69._24_4_ = uVar9;
                auVar69._28_4_ = uVar9;
                uVar14 = vcmpps_avx512vl(local_880,auVar69,0xd);
                uVar9 = *(undefined4 *)(local_b58 + local_b60 * 4 + 0x80);
                auVar63._4_4_ = uVar9;
                auVar63._0_4_ = uVar9;
                auVar63._8_4_ = uVar9;
                auVar63._12_4_ = uVar9;
                auVar63._16_4_ = uVar9;
                auVar63._20_4_ = uVar9;
                auVar63._24_4_ = uVar9;
                auVar63._28_4_ = uVar9;
                uVar15 = vcmpps_avx512vl(local_880,auVar63,2);
                local_8d8 = (byte)uVar14 & (byte)uVar15 & local_8d8;
                if (local_8d8 != 0) {
                  uVar14 = vcmpps_avx512vl(auVar65,_DAT_02020f00,4);
                  local_8d8 = local_8d8 & (byte)uVar14;
                  if (local_8d8 != 0) {
                    local_8e0 = &local_ba5;
                    auVar70 = vsubps_avx(local_900,auVar61);
                    auVar70 = vblendps_avx(auVar46,auVar70,0xf0);
                    auVar69 = vsubps_avx(local_900,auVar46);
                    auVar69 = vblendps_avx(auVar61,auVar69,0xf0);
                    local_860[0] = auVar67._0_4_ * 1.0;
                    local_860[1] = auVar67._4_4_ * 1.0;
                    local_860[2] = auVar67._8_4_ * 1.0;
                    local_860[3] = auVar67._12_4_ * 1.0;
                    fStack_850 = auVar67._16_4_ * -1.0;
                    fStack_84c = auVar67._20_4_ * -1.0;
                    fStack_848 = auVar67._24_4_ * -1.0;
                    uStack_844 = auVar67._28_4_;
                    local_840[0] = auVar68._0_4_ * 1.0;
                    local_840[1] = auVar68._4_4_ * 1.0;
                    local_840[2] = auVar68._8_4_ * 1.0;
                    local_840[3] = auVar68._12_4_ * 1.0;
                    fStack_830 = auVar68._16_4_ * -1.0;
                    fStack_82c = auVar68._20_4_ * -1.0;
                    fStack_828 = auVar68._24_4_ * -1.0;
                    uStack_824 = auVar68._28_4_;
                    local_820[0] = fVar40 * 1.0;
                    local_820[1] = fVar71 * 1.0;
                    local_820[2] = fVar72 * 1.0;
                    local_820[3] = fVar73 * 1.0;
                    fStack_810 = fVar74 * -1.0;
                    fStack_80c = fVar75 * -1.0;
                    fStack_808 = fVar76 * -1.0;
                    uStack_804 = (uint)bVar39 * auVar52._28_4_ | (uint)!bVar39 * auVar55._28_4_;
                    auVar65 = vpbroadcastd_avx512vl();
                    auVar65 = vpaddd_avx2(auVar65,_DAT_0205d4c0);
                    auVar66 = vpbroadcastd_avx512vl();
                    auVar66 = vpaddd_avx2(auVar66,_DAT_0205d4e0);
                    auVar98._0_4_ = (float)(int)(*(ushort *)(local_b90 + 8 + lVar30) - 1);
                    auVar98._4_12_ = auVar47._4_12_;
                    auVar21._12_4_ = 0;
                    auVar21._0_12_ = ZEXT812(0);
                    auVar42 = vrcp14ss_avx512f(auVar21 << 0x20,ZEXT416((uint)auVar98._0_4_));
                    auVar41 = vfnmadd213ss_fma(auVar98,auVar42,SUB6416(ZEXT464(0x40000000),0));
                    fVar82 = auVar42._0_4_ * auVar41._0_4_;
                    auVar41 = vcvtsi2ss_avx512f(auVar56._0_16_,
                                                *(ushort *)(local_b90 + 10 + lVar30) - 1);
                    auVar42 = vrcp14ss_avx512f(auVar21 << 0x20,ZEXT416(auVar41._0_4_));
                    auVar41 = vfnmadd213ss_fma(auVar41,auVar42,SUB6416(ZEXT464(0x40000000),0));
                    fVar40 = auVar42._0_4_ * auVar41._0_4_;
                    auVar65 = vcvtdq2ps_avx(auVar65);
                    fVar83 = auVar65._28_4_ + auVar70._28_4_;
                    fVar71 = (local_900._0_4_ * auVar65._0_4_ + auVar70._0_4_) * fVar82;
                    fVar72 = (local_900._4_4_ * auVar65._4_4_ + auVar70._4_4_) * fVar82;
                    local_940._4_4_ = fVar72;
                    local_940._0_4_ = fVar71;
                    fVar73 = (local_900._8_4_ * auVar65._8_4_ + auVar70._8_4_) * fVar82;
                    local_940._8_4_ = fVar73;
                    fVar74 = (local_900._12_4_ * auVar65._12_4_ + auVar70._12_4_) * fVar82;
                    local_940._12_4_ = fVar74;
                    fVar75 = (local_900._16_4_ * auVar65._16_4_ + auVar70._16_4_) * fVar82;
                    local_940._16_4_ = fVar75;
                    fVar76 = (local_900._20_4_ * auVar65._20_4_ + auVar70._20_4_) * fVar82;
                    local_940._20_4_ = fVar76;
                    fVar82 = (local_900._24_4_ * auVar65._24_4_ + auVar70._24_4_) * fVar82;
                    local_940._24_4_ = fVar82;
                    local_940._28_4_ = fVar83;
                    auVar70 = vcvtdq2ps_avx(auVar66);
                    fVar84 = (local_900._0_4_ * auVar70._0_4_ + auVar69._0_4_) * fVar40;
                    fVar87 = (local_900._4_4_ * auVar70._4_4_ + auVar69._4_4_) * fVar40;
                    local_920._4_4_ = fVar87;
                    local_920._0_4_ = fVar84;
                    fVar88 = (local_900._8_4_ * auVar70._8_4_ + auVar69._8_4_) * fVar40;
                    local_920._8_4_ = fVar88;
                    fVar89 = (local_900._12_4_ * auVar70._12_4_ + auVar69._12_4_) * fVar40;
                    local_920._12_4_ = fVar89;
                    fVar90 = (local_900._16_4_ * auVar70._16_4_ + auVar69._16_4_) * fVar40;
                    local_920._16_4_ = fVar90;
                    fVar91 = (local_900._20_4_ * auVar70._20_4_ + auVar69._20_4_) * fVar40;
                    local_920._20_4_ = fVar91;
                    fVar40 = (local_900._24_4_ * auVar70._24_4_ + auVar69._24_4_) * fVar40;
                    local_920._24_4_ = fVar40;
                    local_920._28_4_ = auVar70._28_4_ + auVar69._28_4_;
                    pGVar12 = (context->scene->geometries).items[*(uint *)(local_a70 + 0x50)].ptr;
                    if ((pGVar12->mask & *(uint *)(local_b58 + local_b60 * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0079f0c1:
                        auVar108 = ZEXT1664(local_a50);
                        auVar109 = ZEXT1664(local_a60);
                        fVar82 = local_a20;
                        fVar72 = fStack_a1c;
                        fVar73 = fStack_a18;
                        fVar74 = fStack_a14;
                        fVar40 = local_a30;
                        fVar75 = fStack_a2c;
                        fVar76 = fStack_a28;
                        fVar83 = fStack_a24;
                        fVar71 = local_a40;
                        fVar84 = fStack_a3c;
                        fVar87 = fStack_a38;
                        fVar88 = fStack_a34;
                        goto LAB_0079f0f2;
                      }
                      auVar17._8_4_ = 0x219392ef;
                      auVar17._0_8_ = 0x219392ef219392ef;
                      auVar17._12_4_ = 0x219392ef;
                      auVar17._16_4_ = 0x219392ef;
                      auVar17._20_4_ = 0x219392ef;
                      auVar17._24_4_ = 0x219392ef;
                      auVar17._28_4_ = 0x219392ef;
                      uVar27 = vcmpps_avx512vl(local_900,auVar17,5);
                      auVar70 = vrcp14ps_avx512vl(local_900);
                      auVar99._8_4_ = 0x3f800000;
                      auVar99._0_8_ = &DAT_3f8000003f800000;
                      auVar99._12_4_ = 0x3f800000;
                      auVar99._16_4_ = 0x3f800000;
                      auVar99._20_4_ = 0x3f800000;
                      auVar99._24_4_ = 0x3f800000;
                      auVar99._28_4_ = 0x3f800000;
                      auVar41 = vfnmadd213ps_fma(local_900,auVar70,auVar99);
                      auVar70 = vfmadd132ps_avx512vl(ZEXT1632(auVar41),auVar70,auVar70);
                      fVar1 = (float)((uint)((byte)uVar27 & 1) * auVar70._0_4_);
                      fVar2 = (float)((uint)((byte)(uVar27 >> 1) & 1) * auVar70._4_4_);
                      fVar3 = (float)((uint)((byte)(uVar27 >> 2) & 1) * auVar70._8_4_);
                      fVar4 = (float)((uint)((byte)(uVar27 >> 3) & 1) * auVar70._12_4_);
                      fVar5 = (float)((uint)((byte)(uVar27 >> 4) & 1) * auVar70._16_4_);
                      fVar6 = (float)((uint)((byte)(uVar27 >> 5) & 1) * auVar70._20_4_);
                      fVar7 = (float)((uint)((byte)(uVar27 >> 6) & 1) * auVar70._24_4_);
                      auVar19._4_4_ = fVar72 * fVar2;
                      auVar19._0_4_ = fVar71 * fVar1;
                      auVar19._8_4_ = fVar73 * fVar3;
                      auVar19._12_4_ = fVar74 * fVar4;
                      auVar19._16_4_ = fVar75 * fVar5;
                      auVar19._20_4_ = fVar76 * fVar6;
                      auVar19._24_4_ = fVar82 * fVar7;
                      auVar19._28_4_ = fVar83;
                      local_8c0 = vminps_avx(auVar19,auVar99);
                      auVar20._4_4_ = fVar87 * fVar2;
                      auVar20._0_4_ = fVar84 * fVar1;
                      auVar20._8_4_ = fVar88 * fVar3;
                      auVar20._12_4_ = fVar89 * fVar4;
                      auVar20._16_4_ = fVar90 * fVar5;
                      auVar20._20_4_ = fVar91 * fVar6;
                      auVar20._24_4_ = fVar40 * fVar7;
                      auVar20._28_4_ = (uint)(byte)(uVar27 >> 7) * auVar70._28_4_;
                      local_8a0 = vminps_avx(auVar20,auVar99);
                      local_b98 = (ulong)local_8d8;
                      bVar39 = local_b98 == 0;
                      if (!bVar39) {
                        local_b88 = 0;
                        for (uVar27 = local_b98; (uVar27 & 1) == 0;
                            uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                          local_b88 = local_b88 + 1;
                        }
                        local_ae0 = vpbroadcastd_avx512vl();
                        local_af0 = vpbroadcastd_avx512vl();
                        local_b00 = auVar110._0_16_;
                        local_b10 = auVar111._0_16_;
                        local_b20 = auVar112._0_16_;
                        local_b30 = auVar113._0_16_;
                        local_b40 = auVar114._0_16_;
                        local_b50 = auVar115._0_16_;
                        do {
                          local_ba4 = CONCAT31(local_ba4._1_3_,bVar39);
                          uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
                          uVar9 = *(undefined4 *)(local_8c0 + local_b88 * 4);
                          local_9a0._4_4_ = uVar9;
                          local_9a0._0_4_ = uVar9;
                          local_9a0._8_4_ = uVar9;
                          local_9a0._12_4_ = uVar9;
                          uVar9 = *(undefined4 *)(local_8a0 + local_b88 * 4);
                          local_990._4_4_ = uVar9;
                          local_990._0_4_ = uVar9;
                          local_990._8_4_ = uVar9;
                          local_990._12_4_ = uVar9;
                          *(float *)(ray + k * 4 + 0x80) = local_860[local_b88 - 8];
                          local_a10.context = context->user;
                          local_9d0 = local_860[local_b88];
                          fVar82 = local_840[local_b88];
                          local_9c0._4_4_ = fVar82;
                          local_9c0._0_4_ = fVar82;
                          local_9c0._8_4_ = fVar82;
                          local_9c0._12_4_ = fVar82;
                          local_9b0 = local_820[local_b88];
                          local_980 = local_af0._0_8_;
                          uStack_978 = local_af0._8_8_;
                          local_970 = local_ae0;
                          vpcmpeqd_avx2(ZEXT1632(local_ae0),ZEXT1632(local_ae0));
                          uStack_95c = (local_a10.context)->instID[0];
                          local_960 = uStack_95c;
                          uStack_958 = uStack_95c;
                          uStack_954 = uStack_95c;
                          uStack_950 = (local_a10.context)->instPrimID[0];
                          uStack_94c = uStack_950;
                          uStack_948 = uStack_950;
                          uStack_944 = uStack_950;
                          local_ad0 = local_9e0._0_8_;
                          uStack_ac8 = local_9e0._8_8_;
                          local_a10.valid = (int *)&local_ad0;
                          local_a10.geometryUserPtr = pGVar12->userPtr;
                          local_a10.hit = (RTCHitN *)&local_9d0;
                          local_a10.N = 4;
                          local_b90 = CONCAT44(local_b90._4_4_,uVar100);
                          local_a10.ray = (RTCRayN *)ray;
                          fStack_9cc = local_9d0;
                          fStack_9c8 = local_9d0;
                          fStack_9c4 = local_9d0;
                          fStack_9ac = local_9b0;
                          fStack_9a8 = local_9b0;
                          fStack_9a4 = local_9b0;
                          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar12->occlusionFilterN)(&local_a10);
                            uVar26 = local_b68;
                            k = local_b60;
                            uVar31 = local_b70;
                            ray = local_b58;
                            uVar33 = local_b78;
                            uVar34 = local_b80;
                            uVar100 = (undefined4)local_b90;
                          }
                          auVar22._8_8_ = uStack_ac8;
                          auVar22._0_8_ = local_ad0;
                          uVar27 = vptestmd_avx512vl(auVar22,auVar22);
                          if ((uVar27 & 0xf) == 0) {
                            auVar110 = ZEXT1664(local_b00);
                            auVar111 = ZEXT1664(local_b10);
                            auVar112 = ZEXT1664(local_b20);
                            auVar113 = ZEXT1664(local_b30);
                            auVar114 = ZEXT1664(local_b40);
                            auVar115 = ZEXT1664(local_b50);
                          }
                          else {
                            p_Var13 = context->args->filter;
                            auVar110 = ZEXT1664(local_b00);
                            auVar111 = ZEXT1664(local_b10);
                            auVar112 = ZEXT1664(local_b20);
                            auVar113 = ZEXT1664(local_b30);
                            auVar114 = ZEXT1664(local_b40);
                            auVar115 = ZEXT1664(local_b50);
                            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var13)(&local_a10);
                              auVar115 = ZEXT1664(local_b50);
                              auVar114 = ZEXT1664(local_b40);
                              auVar113 = ZEXT1664(local_b30);
                              auVar112 = ZEXT1664(local_b20);
                              auVar111 = ZEXT1664(local_b10);
                              auVar110 = ZEXT1664(local_b00);
                              uVar26 = local_b68;
                              k = local_b60;
                              uVar31 = local_b70;
                              ray = local_b58;
                              uVar33 = local_b78;
                              uVar34 = local_b80;
                              uVar100 = (undefined4)local_b90;
                            }
                            auVar23._8_8_ = uStack_ac8;
                            auVar23._0_8_ = local_ad0;
                            uVar27 = vptestmd_avx512vl(auVar23,auVar23);
                            uVar27 = uVar27 & 0xf;
                            auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                            bVar39 = (bool)((byte)uVar27 & 1);
                            auVar45._0_4_ =
                                 (uint)bVar39 * auVar41._0_4_ |
                                 (uint)!bVar39 * *(int *)(local_a10.ray + 0x80);
                            bVar39 = (bool)((byte)(uVar27 >> 1) & 1);
                            auVar45._4_4_ =
                                 (uint)bVar39 * auVar41._4_4_ |
                                 (uint)!bVar39 * *(int *)(local_a10.ray + 0x84);
                            bVar39 = (bool)((byte)(uVar27 >> 2) & 1);
                            auVar45._8_4_ =
                                 (uint)bVar39 * auVar41._8_4_ |
                                 (uint)!bVar39 * *(int *)(local_a10.ray + 0x88);
                            bVar39 = SUB81(uVar27 >> 3,0);
                            auVar45._12_4_ =
                                 (uint)bVar39 * auVar41._12_4_ |
                                 (uint)!bVar39 * *(int *)(local_a10.ray + 0x8c);
                            *(undefined1 (*) [16])(local_a10.ray + 0x80) = auVar45;
                            if ((byte)uVar27 != 0) {
                              if ((local_ba4 & 1) == 0) goto LAB_0079f0c1;
                              break;
                            }
                          }
                          *(undefined4 *)(ray + k * 4 + 0x80) = uVar100;
                          uVar27 = local_b88 & 0x3f;
                          local_b88 = 0;
                          local_b98 = local_b98 ^ 1L << uVar27;
                          for (uVar27 = local_b98; (uVar27 & 1) == 0;
                              uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                            local_b88 = local_b88 + 1;
                          }
                          bVar39 = local_b98 == 0;
                        } while (!bVar39);
                      }
                    }
                  }
                }
              }
              local_a80 = local_a80 - 1 & local_a80;
              auVar108 = ZEXT1664(local_a50);
              auVar109 = ZEXT1664(local_a60);
              fVar82 = local_a20;
              fVar72 = fStack_a1c;
              fVar73 = fStack_a18;
              fVar74 = fStack_a14;
              fVar40 = local_a30;
              fVar75 = fStack_a2c;
              fVar76 = fStack_a28;
              fVar83 = fStack_a24;
              fVar71 = local_a40;
              fVar84 = fStack_a3c;
              fVar87 = fStack_a38;
              fVar88 = fStack_a34;
            } while (local_a80 != 0);
          }
          local_a78 = local_a78 + 1;
          bVar38 = local_a78 < local_ab8;
        } while (local_a78 != local_ab8);
      }
LAB_0079f0f2:
      uVar24 = 0;
      if (bVar38) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar24 = 1;
      }
    }
  } while ((uVar24 & 3) == 0);
  return local_a68 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }